

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::SSBMemberOffsetAndAlignTest::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,SSBMemberOffsetAndAlignTest *this,GLuint param_1,
          ProgramInterface *param_2,STAGES stage)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "if ( (PREFIXblock.at_first_offset  != PREFIXblock.at_eigth_offset   ) ||\n         (PREFIXblock.at_second_offset != PREFIXblock.at_sixth_offset[1]) ||\n         (PREFIXblock.at_third_offset  != PREFIXblock.at_sixth_offset[0]) ||\n         (PREFIXblock.at_fourth_offset != PREFIXblock.at_fifth_offset   )  )\n    {\n        result = 0;\n    }"
             ,&local_19);
  Utils::replaceAllTokens
            ("PREFIX",Utils::ProgramInterface::GetStagePrefix::lut[stage][3],__return_storage_ptr__)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string SSBMemberOffsetAndAlignTest::getVerificationSnippet(GLuint /* test_case_index */,
																Utils::ProgramInterface& /* program_interface */,
																Utils::Shader::STAGES stage)
{
	std::string verification = "if ( (PREFIXblock.at_first_offset  != PREFIXblock.at_eigth_offset   ) ||\n"
							   "         (PREFIXblock.at_second_offset != PREFIXblock.at_sixth_offset[1]) ||\n"
							   "         (PREFIXblock.at_third_offset  != PREFIXblock.at_sixth_offset[0]) ||\n"
							   "         (PREFIXblock.at_fourth_offset != PREFIXblock.at_fifth_offset   )  )\n"
							   "    {\n"
							   "        result = 0;\n"
							   "    }";

	const GLchar* prefix = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::SSB);

	Utils::replaceAllTokens("PREFIX", prefix, verification);

	return verification;
}